

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_CCtx_params * ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters cParams_00;
  ZSTD_paramSwitch_e ZVar1;
  size_t sVar2;
  ZSTD_CCtx_params *in_RDI;
  uint in_stack_00000008;
  uint in_stack_0000000c;
  uint in_stack_00000010;
  uint in_stack_00000014;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  ZSTD_strategy in_stack_00000020;
  
  if (in_RDI != (ZSTD_CCtx_params *)0x0) {
    memset(in_RDI,0,0xd0);
    in_RDI->compressionLevel = 3;
    (in_RDI->fParams).contentSizeFlag = 1;
  }
  (in_RDI->cParams).searchLog = in_stack_00000014;
  (in_RDI->cParams).minMatch = in_stack_00000018;
  (in_RDI->cParams).targetLength = in_stack_0000001c;
  (in_RDI->cParams).strategy = in_stack_00000020;
  (in_RDI->cParams).windowLog = in_stack_00000008;
  (in_RDI->cParams).chainLog = in_stack_0000000c;
  (in_RDI->cParams).hashLog = in_stack_00000010;
  (in_RDI->cParams).searchLog = in_stack_00000014;
  ZVar1 = (in_RDI->ldmParams).enableLdm;
  if ((ZVar1 == ZSTD_ps_auto) && (ZVar1 = ZSTD_ps_disable, ZSTD_btlazy2 < in_stack_00000020)) {
    ZVar1 = (in_stack_00000008 < 0x1b) + ZSTD_ps_enable;
  }
  (in_RDI->ldmParams).enableLdm = ZVar1;
  if (ZVar1 == ZSTD_ps_enable) {
    ZSTD_ldm_adjustParameters(&in_RDI->ldmParams,(ZSTD_compressionParameters *)&stack0x00000008);
    if ((in_RDI->ldmParams).hashLog < (in_RDI->ldmParams).bucketSizeLog) {
      __assert_fail("cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x51fa,
                    "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
    }
    if (0x1f < (in_RDI->ldmParams).hashRateLog) {
      __assert_fail("cctxParams.ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x51fb,
                    "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
    }
  }
  ZVar1 = in_RDI->useBlockSplitter;
  if ((ZVar1 == ZSTD_ps_auto) && (ZVar1 = ZSTD_ps_disable, ZSTD_btlazy2 < in_stack_00000020)) {
    ZVar1 = (in_stack_00000008 < 0x11) + ZSTD_ps_enable;
  }
  in_RDI->useBlockSplitter = ZVar1;
  ZVar1 = in_RDI->useRowMatchFinder;
  if ((ZVar1 == ZSTD_ps_auto) &&
     (ZVar1 = ZSTD_ps_disable, 0xfffffffc < in_stack_00000020 - ZSTD_btlazy2)) {
    ZVar1 = (in_stack_00000008 < 0xf) + ZSTD_ps_enable;
  }
  in_RDI->useRowMatchFinder = ZVar1;
  sVar2 = 0x20000;
  if (in_RDI->maxBlockSize != 0) {
    sVar2 = in_RDI->maxBlockSize;
  }
  in_RDI->maxBlockSize = sVar2;
  ZVar1 = (in_RDI->compressionLevel < 10) + ZSTD_ps_enable;
  if (in_RDI->searchForExternalRepcodes != ZSTD_ps_auto) {
    ZVar1 = in_RDI->searchForExternalRepcodes;
  }
  in_RDI->searchForExternalRepcodes = ZVar1;
  cParams_00.chainLog = in_stack_0000000c;
  cParams_00.windowLog = in_stack_00000008;
  cParams_00.strategy = in_stack_00000020;
  cParams_00.targetLength = in_stack_0000001c;
  cParams_00.hashLog = in_stack_00000010;
  cParams_00.searchLog = in_stack_00000014;
  cParams_00.minMatch = in_stack_00000018;
  sVar2 = ZSTD_checkCParams(cParams_00);
  if (sVar2 == 0) {
    return in_RDI;
  }
  __assert_fail("!ZSTD_checkCParams(cParams)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x5203,
                "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    /* should not matter, as all cParams are presumed properly defined */
    ZSTD_CCtxParams_init(&cctxParams, ZSTD_CLEVEL_DEFAULT);
    cctxParams.cParams = cParams;

    /* Adjust advanced params according to cParams */
    cctxParams.ldmParams.enableLdm = ZSTD_resolveEnableLdm(cctxParams.ldmParams.enableLdm, &cParams);
    if (cctxParams.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_ldm_adjustParameters(&cctxParams.ldmParams, &cParams);
        assert(cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog);
        assert(cctxParams.ldmParams.hashRateLog < 32);
    }
    cctxParams.useBlockSplitter = ZSTD_resolveBlockSplitterMode(cctxParams.useBlockSplitter, &cParams);
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);
    cctxParams.validateSequences = ZSTD_resolveExternalSequenceValidation(cctxParams.validateSequences);
    cctxParams.maxBlockSize = ZSTD_resolveMaxBlockSize(cctxParams.maxBlockSize);
    cctxParams.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(cctxParams.searchForExternalRepcodes,
                                                                             cctxParams.compressionLevel);
    assert(!ZSTD_checkCParams(cParams));
    return cctxParams;
}